

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O1

void __thiscall BailOutRecord::DumpLocalOffsets(BailOutRecord *this,uint count,int argOutSlotStart)

{
  uint uVar1;
  uint uVar2;
  GlobalBailOutRecordDataTable *pGVar3;
  GlobalBailOutRecordDataRow *pGVar4;
  code *pcVar5;
  bool bVar6;
  undefined4 *puVar7;
  undefined4 in_register_00000014;
  long lVar8;
  undefined4 in_register_00000034;
  ulong uVar9;
  
  pGVar3 = this->globalBailOutRecordTable;
  if (pGVar3->length != 0) {
    uVar1 = this->m_bailOutRecordId;
    puVar7 = (undefined4 *)
             __tls_get_addr(&PTR_0155fe48,CONCAT44(in_register_00000034,count),
                            CONCAT44(in_register_00000014,argOutSlotStart));
    lVar8 = 0;
    uVar9 = 0;
    do {
      pGVar4 = pGVar3->globalBailOutRecordDataRows;
      if (uVar1 <= *(uint *)((long)&pGVar4->end + lVar8)) {
        if (uVar1 < *(uint *)((long)&pGVar4->start + lVar8)) {
          return;
        }
        if ((long)&pGVar4->offset + lVar8 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x221,"(row != nullptr)","row != nullptr");
          if (!bVar6) goto LAB_003fcd4d;
          *puVar7 = 0;
        }
        uVar2 = *(uint *)(&pGVar4->field_0xc + lVar8);
        if (0xbfffffff < uVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BailOut.cpp"
                             ,0x226,"(!isFloat64 || !isInt32)","!isFloat64 || !isInt32");
          if (!bVar6) {
LAB_003fcd4d:
            pcVar5 = (code *)invalidInstructionException();
            (*pcVar5)();
          }
          *puVar7 = 0;
        }
        Output::Print(L"%s #%3d: ",L"Register",
                      (ulong)(*(uint *)(&pGVar4->field_0xc + lVar8) & 0x3fffffff));
        DumpValue(this,*(int *)((long)&pGVar4->offset + lVar8),(bool)((byte)(uVar2 >> 0x1e) & 1));
        Output::Print(L"\n");
      }
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 0x10;
    } while (uVar9 < pGVar3->length);
  }
  return;
}

Assistant:

void BailOutRecord::DumpLocalOffsets(uint count, int argOutSlotStart)
{
    char16 const * name = _u("Register");
    globalBailOutRecordTable->IterateGlobalBailOutRecordTableRows(m_bailOutRecordId, [=](GlobalBailOutRecordDataRow *row) {
        Assert(row != nullptr);

        // The variables below determine whether we have a Var or native float/int.
        bool isFloat64 = row->isFloat;
        bool isInt32 = row->isInt;
        Assert(!isFloat64 || !isInt32);

        Output::Print(_u("%s #%3d: "), name, row->regSlot);
        this->DumpValue(row->offset, isFloat64);
        Output::Print(_u("\n"));
    });
}